

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_full_io.c
# Opt level: O0

int s3gau_read_maybe_full
              (char *fn,vector_t *****out,uint32 *out_n_mgau,uint32 *out_n_feat,
              uint32 *out_n_density,uint32 **out_veclen,uint32 need_full)

{
  int iVar1;
  int32 iVar2;
  uint uVar3;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar4;
  uint32 local_b4;
  void ****ppppvStack_b0;
  uint32 swap;
  vector_t ****o;
  float32 *raw;
  uint32 local_98;
  uint32 ignore;
  uint32 sv_chksum;
  uint32 chksum;
  uint32 n;
  uint32 r;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 blk;
  uint32 maxveclen;
  uint32 *veclen;
  uint local_60;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mgau;
  char *ver;
  char *do_chk;
  FILE *fp;
  uint32 **out_veclen_local;
  uint32 *out_n_density_local;
  uint32 *out_n_feat_local;
  uint32 *out_n_mgau_local;
  vector_t *****out_local;
  char *fn_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  ignore = 0;
  raw._4_4_ = 0;
  fp = (FILE *)out_veclen;
  out_veclen_local = (uint32 **)out_n_density;
  out_n_density_local = out_n_feat;
  out_n_feat_local = out_n_mgau;
  out_n_mgau_local = (uint32 *)out;
  out_local = (vector_t *****)fn;
  do_chk = (char *)s3open(fn,"rb",&local_b4);
  if ((FILE *)do_chk == (FILE *)0x0) {
    return -1;
  }
  _n_feat = s3get_gvn_fattr("version");
  if (_n_feat == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
            ,0x5e,"No version attribute for %s\n",out_local);
    exit(1);
  }
  iVar1 = strcmp(_n_feat,"1.0");
  if (iVar1 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
            ,0x5a,"Version mismatch for %s, file ver: %s != reader ver: %s\n",out_local,_n_feat,
            "1.0");
    exit(1);
  }
  ver = s3get_gvn_fattr("chksum0");
  if ((ver != (char *)0x0) && (iVar1 = strcmp(ver,"no"), iVar1 == 0)) {
    ver = (char *)0x0;
  }
  iVar2 = bio_fread(&n_density,4,1,(FILE *)do_chk,local_b4,&ignore);
  if (((iVar2 == 1) &&
      (iVar2 = bio_fread(&local_60,4,1,(FILE *)do_chk,local_b4,&ignore), iVar2 == 1)) &&
     (iVar2 = bio_fread((void *)((long)&veclen + 4),4,1,(FILE *)do_chk,local_b4,&ignore), iVar2 == 1
     )) {
    _blk = __ckd_calloc__((ulong)local_60,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                          ,0x74);
    uVar3 = bio_fread(_blk,4,local_60,(FILE *)do_chk,local_b4,&ignore);
    if (uVar3 == local_60) {
      iVar2 = bio_fread_1d(&o,4,&sv_chksum,(FILE *)do_chk,local_b4,&ignore);
      if (iVar2 < 0) {
        ckd_free(_blk);
      }
      else {
        j = 0;
        i = 0;
        for (k = 0; k < local_60; k = k + 1) {
          j = *(int *)((long)_blk + (ulong)k * 4) * *(int *)((long)_blk + (ulong)k * 4) + j;
          if (i < *(uint *)((long)_blk + (ulong)k * 4)) {
            i = *(uint32 *)((long)_blk + (ulong)k * 4);
          }
        }
        if (sv_chksum == n_density * veclen._4_4_ * j) {
          ppppvStack_b0 =
               __ckd_calloc_4d__((ulong)n_density,(ulong)local_60,(ulong)veclen._4_4_,(ulong)i,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                                 ,0x8b);
          chksum = 0;
          for (k = 0; k < n_density; k = k + 1) {
            for (l = 0; l < local_60; l = l + 1) {
              for (r = 0; r < veclen._4_4_; r = r + 1) {
                for (n = 0; n < *(uint *)((long)_blk + (ulong)l * 4); n = n + 1) {
                  *(ulong *)((long)ppppvStack_b0[k][l][r] + (ulong)n * 8) =
                       (long)o + (ulong)chksum * 4;
                  chksum = *(int *)((long)_blk + (ulong)l * 4) + chksum;
                }
              }
            }
          }
          if (ver != (char *)0x0) {
            iVar2 = bio_fread(&local_98,4,1,(FILE *)do_chk,local_b4,(uint32 *)((long)&raw + 4));
            if (iVar2 != 1) goto LAB_00129f69;
            if (local_98 != ignore) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                      ,0xa2,"Checksum error; read corrupt data.\n");
              exit(1);
            }
          }
          *(void *****)out_n_mgau_local = ppppvStack_b0;
          *out_n_feat_local = n_density;
          *out_n_density_local = local_60;
          *(uint *)out_veclen_local = veclen._4_4_;
          *(void **)fp = _blk;
          s3close((FILE *)do_chk);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                  ,0xb0,"Read %s [%ux%ux%u array of full matrices]\n",out_local,(ulong)n_density,
                  CONCAT44(uVar4,local_60),veclen._4_4_);
          return 0;
        }
        if (need_full != 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                  ,0x86,"Failed to read full covariance file %s (expected %d values, got %d)\n",
                  out_local,(ulong)(n_density * veclen._4_4_ * j),CONCAT44(uVar4,sv_chksum));
        }
      }
    }
  }
LAB_00129f69:
  if (do_chk != (char *)0x0) {
    s3close((FILE *)do_chk);
  }
  return -1;
}

Assistant:

int
s3gau_read_maybe_full(const char *fn,
		      vector_t *****out,
		      uint32 *out_n_mgau,
		      uint32 *out_n_feat,
	  	      uint32 *out_n_density,
		      uint32 **out_veclen,
		      uint32 need_full)
{
    FILE *fp;
    const char *do_chk;
    const char *ver;
    uint32 n_mgau, n_feat, n_density;
    uint32 *veclen, maxveclen;
    uint32 blk, i, j, k, l, r, n;
    uint32 chksum = 0;
    uint32 sv_chksum, ignore = 0;
    float32 *raw;
    vector_t ****o;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, GAU_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, GAU_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    if (do_chk && !strcmp(do_chk, "no")) {
        do_chk = NULL;
    }
    
    if (bio_fread(&n_mgau, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    if (bio_fread(&n_feat, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    if (bio_fread(&n_density, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    veclen = ckd_calloc(n_feat, sizeof(uint32));
    if (bio_fread(veclen, sizeof(uint32), n_feat, fp, swap, &chksum) != n_feat) {
	goto error;
    }

    if (bio_fread_1d((void **)&raw, sizeof(float32), &n, fp, swap, &chksum) < 0) {
	ckd_free(veclen);

	goto error;
    }

    for (i = 0, blk = 0, maxveclen = 0; i < n_feat; i++) {
	blk += veclen[i] * veclen[i];
	if (veclen[i] > maxveclen) maxveclen = veclen[i];
    }
    if (n != n_mgau * n_density * blk) {
	if (need_full)
	     E_ERROR("Failed to read full covariance file %s (expected %d values, got %d)\n",
	     	     fn, n_mgau * n_density * blk, n);
	goto error;
    }

    o = (vector_t ****)ckd_calloc_4d(n_mgau, n_feat, n_density,
				     maxveclen, sizeof(vector_t));

    for (i = 0, r = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    o[i][j][k][l] = &raw[r];

		    r += veclen[j];
		}
	    }
	}
    }

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */

	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
            goto error;
	}

	if (sv_chksum != chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }


    *out = o;
    *out_n_mgau = n_mgau;
    *out_n_feat = n_feat;
    *out_n_density = n_density;
    *out_veclen = veclen;

    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array of full matrices]\n",
	   fn, n_mgau, n_feat, n_density);

    return S3_SUCCESS;

error:
    if (fp) s3close(fp);

    return S3_ERROR;
}